

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraCodeLiteGenerator::CreateNewProjectFile
          (cmExtraCodeLiteGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  TargetType TVar5;
  uint uVar6;
  uint uVar7;
  const_reference ppcVar8;
  char *pcVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *__x;
  pointer __lhs;
  ostream *poVar11;
  reference ppcVar12;
  cmMakefile *this_00;
  pointer ppVar13;
  reference ppcVar14;
  string *psVar15;
  mapped_type *ppcVar16;
  pointer ppVar17;
  reference pbVar18;
  cmSystemTools *pcVar19;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  uint *puVar20;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar21;
  undefined1 local_710 [8];
  string codeliteCompilerName;
  string singleFileCommand;
  string rebuildCommand;
  string buildCommand;
  string cleanCommand;
  SystemInformation info;
  string relativePath_1;
  _Self local_640;
  const_iterator sit_2;
  string relativePath;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
  local_610;
  iterator local_608;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
  local_600;
  const_iterator sit_1;
  string projectPath;
  _Self local_5c8;
  _Self local_5c0;
  const_iterator headerIt;
  string hname;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_590;
  const_iterator ext_1;
  undefined1 local_568 [8];
  string headerBasename;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
  local_540;
  iterator local_538;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
  local_530;
  const_iterator sit;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_500;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4f8;
  const_iterator ext;
  string srcext;
  string lang;
  iterator iStack_4a8;
  bool isCFile;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_4a0;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_498;
  const_iterator si;
  string local_488;
  string local_468;
  undefined1 local_448 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_428;
  iterator ti;
  cmTargets *targets;
  cmMakefile *makefile;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_408;
  const_iterator lg;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  otherFiles;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  cFiles;
  string projectType;
  __normal_iterator<cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
  local_360;
  __normal_iterator<cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
  local_358;
  __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
  local_350;
  const_iterator iterInc;
  vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> incDirsVec;
  string incDirs;
  string local_308 [8];
  string projectName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputFiles;
  string local_2c8 [8];
  string workspaceOutputDir;
  string local_2a0 [8];
  string workspaceSourcePath;
  undefined1 local_270 [8];
  cmGeneratedFileStream fout;
  cmMakefile *mf;
  string *filename_local;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmExtraCodeLiteGenerator *this_local;
  
  ppcVar8 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[](lgs,0);
  fout._576_8_ = cmLocalGenerator::GetMakefile(*ppcVar8);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_270,pcVar9,false);
  bVar1 = std::ios::operator!((ios *)(local_270 + (long)*(_func_int **)((long)local_270 + -0x18)));
  if ((bVar1 & 1) == 0) {
    pcVar9 = cmMakefile::GetHomeDirectory((cmMakefile *)fout._576_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2a0,pcVar9,(allocator *)(workspaceOutputDir.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(workspaceOutputDir.field_2._M_local_buf + 0xf));
    pcVar9 = cmMakefile::GetHomeOutputDirectory((cmMakefile *)fout._576_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2c8,pcVar9,
               (allocator *)
               ((long)&outputFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&outputFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pvVar10 = cmMakefile::GetOutputFiles_abi_cxx11_((cmMakefile *)fout._576_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&projectName.field_2 + 8),pvVar10);
    pcVar9 = cmMakefile::GetProjectName((cmMakefile *)fout._576_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_308,pcVar9,(allocator *)(incDirs.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::~allocator((allocator<char> *)(incDirs.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string
              ((string *)
               &incDirsVec.super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __x = cmMakefile::GetIncludeDirectoriesEntries((cmMakefile *)fout._576_8_);
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::vector
              ((vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *)&iterInc,__x);
    local_358._M_current =
         (cmValueWithOrigin *)
         std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::begin
                   ((vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *)&iterInc);
    __gnu_cxx::
    __normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>
    ::__normal_iterator<cmValueWithOrigin*>
              ((__normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>
                *)&local_350,&local_358);
    while( true ) {
      local_360._M_current =
           (cmValueWithOrigin *)
           std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::end
                     ((vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *)&iterInc);
      bVar2 = __gnu_cxx::operator!=(&local_350,&local_360);
      if (!bVar2) break;
      __lhs = __gnu_cxx::
              __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
              ::operator->(&local_350);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&projectType.field_2 + 8),&__lhs->Value," ");
      std::__cxx11::string::operator+=
                ((string *)
                 &incDirsVec.
                  super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (string *)(projectType.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(projectType.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
      ::operator++(&local_350);
    }
    poVar11 = std::operator<<((ostream *)local_270,
                              "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n<CodeLite_Project Name=\""
                             );
    pcVar9 = cmMakefile::GetProjectName((cmMakefile *)fout._576_8_);
    poVar11 = std::operator<<(poVar11,pcVar9);
    std::operator<<(poVar11,"\" InternalType=\"\">\n");
    std::__cxx11::string::string((string *)&cFiles._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
           *)&otherFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&lg);
    local_408._M_current =
         (cmLocalGenerator **)
         std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(lgs);
    while( true ) {
      makefile = (cmMakefile *)
                 std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(lgs);
      bVar2 = __gnu_cxx::operator!=
                        (&local_408,
                         (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                          *)&makefile);
      if (!bVar2) break;
      ppcVar12 = __gnu_cxx::
                 __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                 ::operator*(&local_408);
      this_00 = cmLocalGenerator::GetMakefile(*ppcVar12);
      ti.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                 )cmMakefile::GetTargets_abi_cxx11_(this_00);
      local_428._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                    *)ti.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                      ._M_cur);
      while( true ) {
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                      ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                             *)ti.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                               ._M_cur);
        bVar2 = std::__detail::operator!=
                          (&local_428,
                           (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                            *)&sources.
                               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar2) break;
        ppVar13 = std::__detail::
                  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                  ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                *)&local_428);
        TVar5 = cmTarget::GetType(&ppVar13->second);
        in_RCX._M_node = (_Base_ptr)(ulong)TVar5;
        puVar20 = &switchD_005a0808::switchdataD_008e2ce8;
        switch(in_RCX._M_node) {
        case (_Base_ptr)0x0:
          std::__cxx11::string::operator=
                    ((string *)&cFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,"Executable"
                    );
          in_RCX._M_node = (_Base_ptr)puVar20;
          break;
        case (_Base_ptr)0x1:
          std::__cxx11::string::operator=
                    ((string *)&cFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     "Static Library");
          in_RCX._M_node = (_Base_ptr)puVar20;
          break;
        case (_Base_ptr)0x2:
          std::__cxx11::string::operator=
                    ((string *)&cFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     "Dynamic Library");
          in_RCX._M_node = (_Base_ptr)puVar20;
          break;
        case (_Base_ptr)0x3:
          std::__cxx11::string::operator=
                    ((string *)&cFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     "Dynamic Library");
          in_RCX._M_node = (_Base_ptr)puVar20;
        }
        ppVar13 = std::__detail::
                  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                  ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                *)&local_428);
        TVar5 = cmTarget::GetType(&ppVar13->second);
        if (TVar5 < OBJECT_LIBRARY) {
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_448);
          ppVar13 = std::__detail::
                    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                  *)&local_428);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_488,"CMAKE_BUILD_TYPE",(allocator *)((long)&si._M_current + 7)
                    );
          pcVar9 = cmMakefile::GetSafeDefinition(this_00,&local_488);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_468,pcVar9,(allocator *)((long)&si._M_current + 6));
          cmTarget::GetSourceFiles
                    (&ppVar13->second,
                     (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_448,&local_468
                    );
          std::__cxx11::string::~string((string *)&local_468);
          std::allocator<char>::~allocator((allocator<char> *)((long)&si._M_current + 6));
          std::__cxx11::string::~string((string *)&local_488);
          std::allocator<char>::~allocator((allocator<char> *)((long)&si._M_current + 7));
          local_4a0._M_current =
               (cmSourceFile **)
               std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                         ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_448);
          __gnu_cxx::
          __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
          ::__normal_iterator<cmSourceFile**>
                    ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                      *)&local_498,&local_4a0);
          while( true ) {
            iStack_4a8 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                                    local_448);
            bVar2 = __gnu_cxx::operator!=(&local_498,&stack0xfffffffffffffb58);
            if (!bVar2) break;
            bVar2 = false;
            ppcVar14 = __gnu_cxx::
                       __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                       ::operator*(&local_498);
            cmSourceFile::GetLanguage_abi_cxx11_((string *)((long)&srcext.field_2 + 8),*ppcVar14);
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&srcext.field_2 + 8),"C");
            if ((bVar3) ||
               (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&srcext.field_2 + 8),"CXX"), bVar3)) {
              ppcVar14 = __gnu_cxx::
                         __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                         ::operator*(&local_498);
              psVar15 = cmSourceFile::GetExtension_abi_cxx11_(*ppcVar14);
              std::__cxx11::string::string((string *)&ext,(string *)psVar15);
              pvVar10 = cmMakefile::GetSourceExtensions_abi_cxx11_((cmMakefile *)fout._576_8_);
              local_4f8._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(pvVar10);
              while( true ) {
                pvVar10 = cmMakefile::GetSourceExtensions_abi_cxx11_((cmMakefile *)fout._576_8_);
                local_500._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(pvVar10);
                bVar3 = __gnu_cxx::operator!=(&local_4f8,&local_500);
                if (!bVar3) break;
                pbVar18 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_4f8);
                _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&ext,pbVar18);
                if (_Var4) {
                  bVar2 = true;
                  break;
                }
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_4f8);
              }
              std::__cxx11::string::~string((string *)&ext);
            }
            if (bVar2) {
              ppcVar14 = __gnu_cxx::
                         __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                         ::operator*(&local_498);
              in_RCX._M_node = (_Base_ptr)*ppcVar14;
              ppcVar14 = __gnu_cxx::
                         __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                         ::operator*(&local_498);
              psVar15 = cmSourceFile::GetFullPath(*ppcVar14,(string *)0x0);
              ppcVar16 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                                       *)&otherFiles._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,psVar15);
              *ppcVar16 = (mapped_type)in_RCX._M_node;
            }
            else {
              ppcVar14 = __gnu_cxx::
                         __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                         ::operator*(&local_498);
              psVar15 = cmSourceFile::GetFullPath(*ppcVar14,(string *)0x0);
              pVar21 = std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&lg,psVar15);
              in_RCX = pVar21.first._M_node;
            }
            std::__cxx11::string::~string((string *)(srcext.field_2._M_local_buf + 8));
            __gnu_cxx::
            __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
            ::operator++(&local_498,0);
          }
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_448);
        }
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                      *)&local_428,0);
      }
      sit._M_node = (_Base_ptr)
                    __gnu_cxx::
                    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                    ::operator++(&local_408,0);
    }
    local_538._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                  *)&otherFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
    ::_Rb_tree_const_iterator(&local_530,&local_538);
    while( true ) {
      headerBasename.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                  *)&otherFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
      ::_Rb_tree_const_iterator(&local_540,(iterator *)((long)&headerBasename.field_2 + 8));
      bVar2 = std::operator!=(&local_530,&local_540);
      if (!bVar2) break;
      ppVar17 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
                ::operator->(&local_530);
      cmsys::SystemTools::GetFilenamePath((string *)local_568,&ppVar17->first);
      std::__cxx11::string::operator+=((string *)local_568,"/");
      ppVar17 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
                ::operator->(&local_530);
      cmsys::SystemTools::GetFilenameWithoutExtension((string *)&ext_1,&ppVar17->first);
      std::__cxx11::string::operator+=((string *)local_568,(string *)&ext_1);
      std::__cxx11::string::~string((string *)&ext_1);
      pvVar10 = cmMakefile::GetHeaderExtensions_abi_cxx11_((cmMakefile *)fout._576_8_);
      local_590._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar10);
      while( true ) {
        pvVar10 = cmMakefile::GetHeaderExtensions_abi_cxx11_((cmMakefile *)fout._576_8_);
        hname.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(pvVar10);
        bVar2 = __gnu_cxx::operator!=
                          (&local_590,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&hname.field_2 + 8));
        if (!bVar2) break;
        std::__cxx11::string::string((string *)&headerIt,(string *)local_568);
        std::__cxx11::string::operator+=((string *)&headerIt,".");
        pbVar18 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_590);
        std::__cxx11::string::operator+=((string *)&headerIt,(string *)pbVar18);
        local_5c0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&lg,(key_type *)&headerIt);
        local_5c8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&lg);
        bVar2 = std::operator!=(&local_5c0,&local_5c8);
        if (bVar2) {
          workspaceSourcePath.field_2._8_4_ = 0x16;
        }
        else {
          pcVar9 = (char *)std::__cxx11::string::c_str();
          bVar2 = cmsys::SystemTools::FileExists(pcVar9);
          if (bVar2) {
            pVar21 = std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&lg,(value_type *)&headerIt);
            in_RCX = pVar21.first._M_node;
            workspaceSourcePath.field_2._8_4_ = 0x16;
          }
          else {
            workspaceSourcePath.field_2._8_4_ = 0;
          }
        }
        std::__cxx11::string::~string((string *)&headerIt);
        if (workspaceSourcePath.field_2._8_4_ != 0) break;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_590);
      }
      std::__cxx11::string::~string((string *)local_568);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
      ::operator++(&local_530);
    }
    cmsys::SystemTools::GetFilenamePath((string *)&sit_1,filename);
    std::operator<<((ostream *)local_270,"  <VirtualDirectory Name=\"src\">\n");
    local_608._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                  *)&otherFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
    ::_Rb_tree_const_iterator(&local_600,&local_608);
    while( true ) {
      relativePath.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                  *)&otherFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
      ::_Rb_tree_const_iterator(&local_610,(iterator *)((long)&relativePath.field_2 + 8));
      bVar2 = std::operator!=(&local_600,&local_610);
      if (!bVar2) break;
      pcVar19 = (cmSystemTools *)std::__cxx11::string::c_str();
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
      ::operator->(&local_600);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::RelativePath_abi_cxx11_((string *)&sit_2,pcVar19,pcVar9,(char *)in_RCX._M_node)
      ;
      poVar11 = std::operator<<((ostream *)local_270,"    <File Name=\"");
      poVar11 = std::operator<<(poVar11,(string *)&sit_2);
      std::operator<<(poVar11,"\"/>\n");
      std::__cxx11::string::~string((string *)&sit_2);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
      ::operator++(&local_600);
    }
    std::operator<<((ostream *)local_270,"  </VirtualDirectory>\n");
    std::operator<<((ostream *)local_270,"  <VirtualDirectory Name=\"include\">\n");
    local_640._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&lg);
    while( true ) {
      relativePath_1.field_2._8_8_ =
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&lg);
      bVar2 = std::operator!=(&local_640,(_Self *)((long)&relativePath_1.field_2 + 8));
      if (!bVar2) break;
      pcVar19 = (cmSystemTools *)std::__cxx11::string::c_str();
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator->(&local_640);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::RelativePath_abi_cxx11_((string *)&info,pcVar19,pcVar9,(char *)in_RCX._M_node);
      poVar11 = std::operator<<((ostream *)local_270,"    <File Name=\"");
      poVar11 = std::operator<<(poVar11,(string *)&info);
      std::operator<<(poVar11,"\"/>\n");
      std::__cxx11::string::~string((string *)&info);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_640);
    }
    std::operator<<((ostream *)local_270,"  </VirtualDirectory>\n");
    cmsys::SystemInformation::SystemInformation
              ((SystemInformation *)((long)&cleanCommand.field_2 + 8));
    cmsys::SystemInformation::RunCPUCheck((SystemInformation *)((long)&cleanCommand.field_2 + 8));
    uVar6 = cmsys::SystemInformation::GetNumberOfLogicalCPU
                      ((SystemInformation *)((long)&cleanCommand.field_2 + 8));
    uVar7 = cmsys::SystemInformation::GetNumberOfPhysicalCPU
                      ((SystemInformation *)((long)&cleanCommand.field_2 + 8));
    this->CpuCount = uVar6 * uVar7;
    GetCleanCommand_abi_cxx11_
              ((string *)((long)&buildCommand.field_2 + 8),this,(cmMakefile *)fout._576_8_);
    GetBuildCommand_abi_cxx11_
              ((string *)((long)&rebuildCommand.field_2 + 8),this,(cmMakefile *)fout._576_8_);
    GetRebuildCommand_abi_cxx11_
              ((string *)((long)&singleFileCommand.field_2 + 8),this,(cmMakefile *)fout._576_8_);
    GetSingleFileBuildCommand_abi_cxx11_
              ((string *)((long)&codeliteCompilerName.field_2 + 8),this,(cmMakefile *)fout._576_8_);
    GetCodeLiteCompilerName_abi_cxx11_((string *)local_710,this,(cmMakefile *)fout._576_8_);
    poVar11 = std::operator<<((ostream *)local_270,"\n  <Settings Type=\"");
    poVar11 = std::operator<<(poVar11,(string *)
                                      &cFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    poVar11 = std::operator<<(poVar11,"\">\n    <Configuration Name=\"");
    poVar11 = std::operator<<(poVar11,(string *)&this->ConfigName);
    poVar11 = std::operator<<(poVar11,"\" CompilerType=\"");
    poVar11 = std::operator<<(poVar11,(string *)local_710);
    poVar11 = std::operator<<(poVar11,"\" DebuggerType=\"GNU gdb debugger\" Type=\"");
    poVar11 = std::operator<<(poVar11,(string *)
                                      &cFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    poVar11 = std::operator<<(poVar11,
                              "\" BuildCmpWithGlobalSettings=\"append\" BuildLnkWithGlobalSettings=\"append\" BuildResWithGlobalSettings=\"append\">\n      <Compiler Options=\"-g\" Required=\"yes\" PreCompiledHeader=\"\">\n        <IncludePath Value=\".\"/>\n      </Compiler>\n      <Linker Options=\"\" Required=\"yes\"/>\n      <ResourceCompiler Options=\"\" Required=\"no\"/>\n      <General OutputFile=\"$(IntermediateDirectory)/$(ProjectName)\" IntermediateDirectory=\"./\" Command=\"./$(ProjectName)\" CommandArguments=\"\" WorkingDirectory=\"$(IntermediateDirectory)\" PauseExecWhenProcTerminates=\"yes\"/>\n      <Debugger IsRemote=\"no\" RemoteHostName=\"\" RemoteHostPort=\"\" DebuggerPath=\"\">\n        <PostConnectCommands/>\n        <StartupCommands/>\n      </Debugger>\n      <PreBuild/>\n      <PostBuild/>\n      <CustomBuild Enabled=\"yes\">\n        <RebuildCommand>"
                             );
    poVar11 = std::operator<<(poVar11,(string *)(singleFileCommand.field_2._M_local_buf + 8));
    poVar11 = std::operator<<(poVar11,"</RebuildCommand>\n        <CleanCommand>");
    poVar11 = std::operator<<(poVar11,(string *)(buildCommand.field_2._M_local_buf + 8));
    poVar11 = std::operator<<(poVar11,"</CleanCommand>\n        <BuildCommand>");
    poVar11 = std::operator<<(poVar11,(string *)(rebuildCommand.field_2._M_local_buf + 8));
    poVar11 = std::operator<<(poVar11,"</BuildCommand>\n        <SingleFileCommand>");
    poVar11 = std::operator<<(poVar11,(string *)(codeliteCompilerName.field_2._M_local_buf + 8));
    std::operator<<(poVar11,
                    "</SingleFileCommand>\n        <PreprocessFileCommand/>\n        <WorkingDirectory>$(WorkspacePath)</WorkingDirectory>\n      </CustomBuild>\n      <AdditionalRules>\n        <CustomPostBuild/>\n        <CustomPreBuild/>\n      </AdditionalRules>\n    </Configuration>\n    <GlobalSettings>\n      <Compiler Options=\"\">\n        <IncludePath Value=\".\"/>\n      </Compiler>\n      <Linker Options=\"\">\n        <LibraryPath Value=\".\"/>\n      </Linker>\n      <ResourceCompiler Options=\"\"/>\n    </GlobalSettings>\n  </Settings>\n</CodeLite_Project>\n"
                   );
    std::__cxx11::string::~string((string *)local_710);
    std::__cxx11::string::~string((string *)(codeliteCompilerName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(singleFileCommand.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(rebuildCommand.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(buildCommand.field_2._M_local_buf + 8));
    cmsys::SystemInformation::~SystemInformation
              ((SystemInformation *)((long)&cleanCommand.field_2 + 8));
    std::__cxx11::string::~string((string *)&sit_1);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&lg);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
            *)&otherFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string
              ((string *)&cFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::~vector
              ((vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *)&iterInc);
    std::__cxx11::string::~string
              ((string *)
               &incDirsVec.super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string(local_308);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&projectName.field_2 + 8));
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::~string(local_2a0);
    workspaceSourcePath.field_2._8_4_ = 0;
  }
  else {
    workspaceSourcePath.field_2._8_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_270);
  return;
}

Assistant:

void cmExtraCodeLiteGenerator
::CreateNewProjectFile(const std::vector<cmLocalGenerator*>& lgs,
                       const std::string& filename)
{
  const cmMakefile* mf=lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return;
    }

  // figure out the compiler
  //std::string compiler = this->GetCBCompilerId(mf);
  std::string workspaceSourcePath = mf->GetHomeDirectory();
  std::string workspaceOutputDir =  mf->GetHomeOutputDirectory();
  std::vector<std::string> outputFiles = mf->GetOutputFiles();
  std::string projectName = mf->GetProjectName();
  std::string incDirs;
  std::vector<cmValueWithOrigin> incDirsVec =
    mf->GetIncludeDirectoriesEntries();
  std::vector<cmValueWithOrigin>::const_iterator iterInc = incDirsVec.begin();

  //std::cout << "GetIncludeDirectories:" << std::endl;
  for(; iterInc != incDirsVec.end(); ++iterInc )
    {
    //std::cout << (*ItStrVec) << std::endl;
    incDirs += iterInc->Value + " ";
    }

  ////////////////////////////////////
  fout << "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n"
       "<CodeLite_Project Name=\"" << mf->GetProjectName()
       << "\" InternalType=\"\">\n";

  // Collect all used source files in the project
  // Sort them into two containers, one for C/C++ implementation files
  // which may have an acompanying header, one for all other files
  std::string projectType;

  std::map<std::string, cmSourceFile*> cFiles;
  std::set<std::string> otherFiles;
  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    cmTargets& targets=makefile->GetTargets();
    for (cmTargets::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {

      switch(ti->second.GetType())
        {
        case cmTarget::EXECUTABLE:
          {
          projectType = "Executable";
          }
        break;
        case cmTarget::STATIC_LIBRARY:
          {
          projectType = "Static Library";
          }
        break;
        case cmTarget::SHARED_LIBRARY:
          {
          projectType = "Dynamic Library";
          }
        break;
        case cmTarget::MODULE_LIBRARY:
          {
          projectType = "Dynamic Library";
          }
        break;
        default:  // intended fallthrough
          break;
        }

      switch(ti->second.GetType())
        {
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
          {
          std::vector<cmSourceFile*> sources;
          ti->second.GetSourceFiles(sources,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (std::vector<cmSourceFile*>::const_iterator si=sources.begin();
               si!=sources.end(); si++)
            {
            // check whether it is a C/C++ implementation file
            bool isCFile = false;
            std::string lang = (*si)->GetLanguage();
            if (lang == "C" || lang == "CXX")
              {
              std::string srcext = (*si)->GetExtension();
              for(std::vector<std::string>::const_iterator
                  ext = mf->GetSourceExtensions().begin();
                  ext !=  mf->GetSourceExtensions().end();
                  ++ext)
                {
                if (srcext == *ext)
                  {
                  isCFile = true;
                  break;
                  }
                }
              }

            // then put it accordingly into one of the two containers
            if (isCFile)
              {
              cFiles[(*si)->GetFullPath()] = *si ;
              }
            else
              {
              otherFiles.insert((*si)->GetFullPath());
              }
            }
          }
        default:  // intended fallthrough
          break;
        }
      }
    }

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the kdevelop
  // project generator.
  for (std::map<std::string, cmSourceFile*>::const_iterator
       sit=cFiles.begin();
       sit!=cFiles.end();
       ++sit)
    {
    std::string headerBasename=cmSystemTools::GetFilenamePath(sit->first);
    headerBasename+="/";
    headerBasename+=cmSystemTools::GetFilenameWithoutExtension(sit->first);

    // check if there's a matching header around
    for(std::vector<std::string>::const_iterator
        ext = mf->GetHeaderExtensions().begin();
        ext !=  mf->GetHeaderExtensions().end();
        ++ext)
      {
      std::string hname=headerBasename;
      hname += ".";
      hname += *ext;
      // if it's already in the set, don't check if it exists on disk
      std::set<std::string>::const_iterator headerIt=otherFiles.find(hname);
      if (headerIt != otherFiles.end())
        {
        break;
        }

      if(cmSystemTools::FileExists(hname.c_str()))
        {
        otherFiles.insert(hname);
        break;
        }
      }
    }

  // Get the project path ( we need it later to convert files to
  // their relative path)
  std::string projectPath = cmSystemTools::GetFilenamePath(filename);

  // Create 2 virtual folders: src and include
  // and place all the implementation files into the src
  // folder, the rest goes to the include folder
  fout<< "  <VirtualDirectory Name=\"src\">\n";

  // insert all source files in the codelite project
  // first the C/C++ implementation files, then all others
  for (std::map<std::string, cmSourceFile*>::const_iterator
       sit=cFiles.begin();
       sit!=cFiles.end();
       ++sit)
    {
    std::string relativePath =
      cmSystemTools::RelativePath(projectPath.c_str(), sit->first.c_str());
    fout<< "    <File Name=\"" << relativePath << "\"/>\n";
    }
  fout<< "  </VirtualDirectory>\n";
  fout<< "  <VirtualDirectory Name=\"include\">\n";
  for (std::set<std::string>::const_iterator
       sit=otherFiles.begin();
       sit!=otherFiles.end();
       ++sit)
    {
    std::string relativePath =
      cmSystemTools::RelativePath(projectPath.c_str(), sit->c_str());
    fout << "    <File Name=\"" << relativePath << "\"/>\n";
    }
  fout << "  </VirtualDirectory>\n";

  // Get the number of CPUs. We use this information for the make -jN
  // command
  cmsys::SystemInformation info;
  info.RunCPUCheck();

  this->CpuCount = info.GetNumberOfLogicalCPU() *
                   info.GetNumberOfPhysicalCPU();

  std::string cleanCommand      = GetCleanCommand(mf);
  std::string buildCommand      = GetBuildCommand(mf);
  std::string rebuildCommand    = GetRebuildCommand(mf);
  std::string singleFileCommand = GetSingleFileBuildCommand(mf);

  std::string codeliteCompilerName = this->GetCodeLiteCompilerName(mf);

  fout << "\n"
     "  <Settings Type=\"" << projectType << "\">\n"
     "    <Configuration Name=\"" << this->ConfigName << "\" CompilerType=\""
     << codeliteCompilerName << "\" DebuggerType=\"GNU gdb debugger\" "
     "Type=\""
     << projectType << "\" BuildCmpWithGlobalSettings=\"append\" "
     "BuildLnkWithGlobalSettings=\"append\" "
     "BuildResWithGlobalSettings=\"append\">\n"
     "      <Compiler Options=\"-g\" "
     "Required=\"yes\" PreCompiledHeader=\"\">\n"
     "        <IncludePath Value=\".\"/>\n"
     "      </Compiler>\n"
     "      <Linker Options=\"\" Required=\"yes\"/>\n"
     "      <ResourceCompiler Options=\"\" Required=\"no\"/>\n"
     "      <General OutputFile=\"$(IntermediateDirectory)/$(ProjectName)\" "
     "IntermediateDirectory=\"./\" Command=\"./$(ProjectName)\" "
     "CommandArguments=\"\" WorkingDirectory=\"$(IntermediateDirectory)\" "
     "PauseExecWhenProcTerminates=\"yes\"/>\n"
     "      <Debugger IsRemote=\"no\" RemoteHostName=\"\" "
     "RemoteHostPort=\"\" DebuggerPath=\"\">\n"
     "        <PostConnectCommands/>\n"
     "        <StartupCommands/>\n"
     "      </Debugger>\n"
     "      <PreBuild/>\n"
     "      <PostBuild/>\n"
     "      <CustomBuild Enabled=\"yes\">\n"
     "        <RebuildCommand>" << rebuildCommand << "</RebuildCommand>\n"
     "        <CleanCommand>" << cleanCommand << "</CleanCommand>\n"
     "        <BuildCommand>" << buildCommand << "</BuildCommand>\n"
     "        <SingleFileCommand>" << singleFileCommand
     << "</SingleFileCommand>\n"
     "        <PreprocessFileCommand/>\n"
     "        <WorkingDirectory>$(WorkspacePath)</WorkingDirectory>\n"
     "      </CustomBuild>\n"
     "      <AdditionalRules>\n"
     "        <CustomPostBuild/>\n"
     "        <CustomPreBuild/>\n"
     "      </AdditionalRules>\n"
     "    </Configuration>\n"
     "    <GlobalSettings>\n"
     "      <Compiler Options=\"\">\n"
     "        <IncludePath Value=\".\"/>\n"
     "      </Compiler>\n"
     "      <Linker Options=\"\">\n"
     "        <LibraryPath Value=\".\"/>\n"
     "      </Linker>\n"
     "      <ResourceCompiler Options=\"\"/>\n"
     "    </GlobalSettings>\n"
     "  </Settings>\n"
     "</CodeLite_Project>\n";
}